

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int nni_proto_open(nng_socket *sip,nni_proto *proto)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *local_20;
  nni_sock *sock;
  
  iVar1 = nni_sock_open(&local_20,proto);
  if (iVar1 == 0) {
    uVar2 = nni_sock_id(local_20);
    sip->id = uVar2;
  }
  return iVar1;
}

Assistant:

int
nni_proto_open(nng_socket *sip, const nni_proto *proto)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_open(&sock, proto)) == 0) {
		nng_socket s;
		s.id = nni_sock_id(sock); // Keep socket held open.
		*sip = s;
	}
	return (rv);
}